

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall
embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication
          (SceneLoadingTutorialApplication *this,string *tutorialName,int features)

{
  long *plVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  float fVar3;
  string *in_stack_ffffffffffffebe8;
  Application *in_stack_ffffffffffffebf0;
  allocator *paVar4;
  string *in_stack_ffffffffffffebf8;
  string *name;
  Application *in_stack_ffffffffffffec00;
  Application *this_00;
  size_t in_stack_ffffffffffffec08;
  GroupNode *in_stack_ffffffffffffec10;
  allocator local_10a1;
  string local_10a0 [47];
  undefined1 local_1071 [40];
  undefined1 local_1049 [48];
  allocator local_1019;
  string local_1018 [39];
  allocator local_ff1;
  string local_ff0 [47];
  allocator local_fc1;
  string local_fc0 [39];
  allocator local_f99;
  string local_f98 [47];
  allocator local_f69;
  string local_f68 [39];
  allocator local_f41;
  string local_f40 [47];
  allocator local_f11;
  string local_f10 [39];
  allocator local_ee9;
  string local_ee8 [47];
  allocator local_eb9;
  string local_eb8 [39];
  allocator local_e91;
  string local_e90 [47];
  allocator local_e61;
  string local_e60 [39];
  allocator local_e39;
  string local_e38 [47];
  allocator local_e09;
  string local_e08 [39];
  allocator local_de1;
  string local_de0 [47];
  allocator local_db1;
  string local_db0 [39];
  allocator local_d89;
  string local_d88 [47];
  allocator local_d59;
  string local_d58 [39];
  allocator local_d31;
  string local_d30 [47];
  allocator local_d01;
  string local_d00 [39];
  allocator local_cd9;
  string local_cd8 [47];
  allocator local_ca9;
  string local_ca8 [39];
  allocator local_c81;
  string local_c80 [47];
  allocator local_c51;
  string local_c50 [39];
  allocator local_c29;
  string local_c28 [47];
  allocator local_bf9;
  string local_bf8 [39];
  allocator local_bd1;
  string local_bd0 [47];
  allocator local_ba1;
  string local_ba0 [39];
  allocator local_b79;
  string local_b78 [47];
  allocator local_b49;
  string local_b48 [39];
  allocator local_b21;
  string local_b20 [47];
  allocator local_af1;
  string local_af0 [39];
  allocator local_ac9;
  string local_ac8 [47];
  allocator local_a99;
  string local_a98 [39];
  allocator local_a71;
  string local_a70 [44];
  int in_stack_fffffffffffff5bc;
  int in_stack_fffffffffffff5c0;
  int in_stack_fffffffffffff5c4;
  string *in_stack_fffffffffffff5c8;
  TutorialApplication *in_stack_fffffffffffff5d0;
  allocator local_a19;
  string local_a18 [47];
  allocator local_9e9;
  string local_9e8 [39];
  allocator local_9c1;
  string local_9c0 [39];
  allocator local_999;
  string local_998 [39];
  allocator local_971;
  string local_970 [47];
  allocator local_941;
  string local_940 [39];
  allocator local_919;
  string local_918 [47];
  allocator local_8e9;
  string local_8e8 [39];
  allocator local_8c1;
  string local_8c0 [39];
  allocator local_899;
  string local_898 [39];
  allocator local_871;
  string local_870 [47];
  allocator local_841;
  string local_840 [39];
  allocator local_819;
  string local_818 [39];
  allocator local_7f1;
  string local_7f0 [39];
  allocator local_7c9;
  string local_7c8 [47];
  allocator local_799;
  string local_798 [39];
  allocator local_771;
  string local_770 [47];
  allocator local_741;
  string local_740 [39];
  allocator local_719;
  string local_718 [47];
  allocator local_6e9;
  string local_6e8 [39];
  allocator local_6c1;
  string local_6c0 [47];
  allocator local_691;
  string local_690 [39];
  allocator local_669;
  string local_668 [47];
  allocator local_639;
  string local_638 [39];
  allocator local_611;
  string local_610 [47];
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [47];
  allocator local_589;
  string local_588 [39];
  allocator local_561;
  string local_560 [47];
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [47];
  allocator local_4d9;
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [47];
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [47];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [47];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [47];
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [47];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [47];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [47];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [47];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [47];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [47];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [47];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [47];
  allocator local_69;
  string local_68 [72];
  void *local_20;
  long *local_18;
  undefined1 *local_10;
  
  TutorialApplication::TutorialApplication
            (in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c4,
             in_stack_fffffffffffff5c0,in_stack_fffffffffffff5bc);
  *in_RDI = &PTR__SceneLoadingTutorialApplication_005f1950;
  TutorialScene::TutorialScene((TutorialScene *)in_stack_ffffffffffffebf0);
  plVar1 = in_RDI + 0x6f;
  pvVar2 = ::operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(in_stack_ffffffffffffec10,in_stack_ffffffffffffec08);
  *plVar1 = (long)pvVar2;
  local_20 = pvVar2;
  local_18 = plVar1;
  if (*plVar1 != 0) {
    (**(code **)(*(long *)*plVar1 + 0x10))();
  }
  std::
  vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
  ::vector((vector<embree::SceneLoadingTutorialApplication::SceneGraphOperations,_std::allocator<embree::SceneLoadingTutorialApplication::SceneGraphOperations>_>
            *)0x12bc47);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)0x12bc63);
  local_10 = &inf;
  fVar3 = std::numeric_limits<float>::infinity();
  *(float *)(in_RDI + 0x76) = fVar3;
  *(undefined4 *)((long)in_RDI + 0x3b4) = 2;
  *(undefined4 *)(in_RDI + 0x77) = 2;
  *(undefined1 *)((long)in_RDI + 0x3bc) = 0;
  *(undefined1 *)((long)in_RDI + 0x3bd) = 0;
  in_RDI[0x78] = 0;
  in_RDI[0x79] = 0;
  in_RDI[0x7a] = 0;
  std::vector<embree::FileName,_std::allocator<embree::FileName>_>::vector
            ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)0x12bd01);
  std::vector<embree::FileName,_std::allocator<embree::FileName>_>::vector
            ((vector<embree::FileName,_std::allocator<embree::FileName>_> *)0x12bd1d);
  *(undefined4 *)(in_RDI + 0x7e) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x7f));
  *(undefined1 *)(in_RDI + 0x83) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x84));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"i",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"-i <filename>: parses scene from <filename>",&local_99);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__21>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"animlist",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f0,
             "-animlist <filename>: parses a sequence of .obj/.xml files listed in <filename> and adds them to the scene"
             ,&local_f1);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__22>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"convert-triangles-to-quads",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_148,"--convert-triangles-to-quads: converts all triangles to quads when loading",
             &local_149);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__23>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"convert-triangles-to-triangles-and-quads",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1a0,
             "--convert-triangles-to-triangles-and-quads: converts to mixed triangle/quad scene",
             &local_1a1);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__24>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"convert-bezier-to-lines",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f8,
             "--convert-bezier-to-lines: converts all bezier curves to line segments when loading",
             &local_1f9);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__25>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"convert-flat-to-round-curves",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_250,"--convert-flat-to-round-curves: converts all flat curves to round curves",
             &local_251);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__26>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"convert-flat-to-round-curves",&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"convert-hair-to-curves",&local_2a1);
  Application::registerOptionAlias
            (in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,(string *)0x12c2cf);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"convert-round-to-flat-curves",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2f8,"--convert-round-to-flat-curves: converts all round curves to flat curves",
             &local_2f9);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__27>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"convert-bezier-to-bspline",&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_350,"--convert-bezier-to-bspline: converts all bezier curves to bsplines curves",
             &local_351);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__28>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"convert-bspline-to-bezier",&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3a8,"--convert-bspline-to-bezier: converts all bsplines curves to bezier curves",
             &local_3a9);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__29>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"convert-bezier-to-hermite",&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_400,"--convert-bezier-to-hermite: converts all bezier curves to hermite curves",
             &local_401);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__30>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"merge-triangles-to-grids",&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_458,"--merge-triangles-to-grids: merges quads to grids",&local_459);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__31>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"merge-quads-to-grids",&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b0,"--merge-quads-to-grids: merges quads to grids",&local_4b1)
  ;
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__32>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d8,"convert-quads-to-grids",&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_508,"--convert-quads-to-grids: converts all quads to grids",&local_509);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__33>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_530,"convert-grids-to-quads",&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_560,"--convert-grids-to-quads: converts all grids to quads",&local_561);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__34>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_588,"convert-triangles-to-grids",&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5b8,"--convert-triangles-to-grids: converts all triangles to grids",&local_5b9);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__35>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"convert-triangles-to-grids-to-quads",&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_610,
             "--convert-triangles-to-grids-to-quads: converts all triangles to grids and then to quads"
             ,&local_611);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__36>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_638,"grid-res",&local_639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_668,"--grid-res: sets tessellation resolution for the grid primitive",&local_669)
  ;
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__37>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator((allocator<char> *)&local_639);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_690,"convert-mblur-to-nonmblur",&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6c0,
             "--convert-mblur-to-nonmblur: converts all motion blur geometry to non-motion blur geometry"
             ,&local_6c1);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__38>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e8,"remove-mblur",&local_6e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_718,"--remove-mblur: removes all motion blur geometry",&local_719);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__39>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::__cxx11::string::~string(local_6e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"remove-non-mblur",&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_770,"--remove-non-mblur: removes all non-motion blur geometry",&local_771);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__40>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_798,"instancing",&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7c8,
             "--instancing: set instancing mode\n  none: perform no instancing and flatten entire scene\n  geometry: instance individual geometries as scenes\n  group: instance geometry groups as scenes\n  multi_level: use multi-level instancing\n  flattened: assume flattened scene graph"
             ,&local_7c9);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__41>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f0,"animation",&local_7f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_818,"--animation: render animated geometries",&local_819);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__42>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_1_0_00000001_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"ambientlight",&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_870,"--ambientlight r g b: adds an ambient light with intensity rgb",&local_871);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__0>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator((allocator<char> *)&local_871);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_898,"ambientlight",&local_899);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8c0,"ambient",&local_8c1);
  Application::registerOptionAlias
            (in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,(string *)0x12d159);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
  std::__cxx11::string::~string(local_898);
  std::allocator<char>::~allocator((allocator<char> *)&local_899);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e8,"pointlight",&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_918,
             "--pointlight x y z r g b: adds a point light at position xyz with intensity rgb",
             &local_919);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__1>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_918);
  std::allocator<char>::~allocator((allocator<char> *)&local_919);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_940,"directionallight",&local_941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_970,
             "--directionallight x y z r g b: adds a directional light with direction xyz and intensity rgb"
             ,&local_971);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__2>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  std::__cxx11::string::~string(local_940);
  std::allocator<char>::~allocator((allocator<char> *)&local_941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_998,"directionallight",&local_999);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c0,"dirlight",&local_9c1);
  Application::registerOptionAlias
            (in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,(string *)0x12d3b4);
  std::__cxx11::string::~string(local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  std::__cxx11::string::~string(local_998);
  std::allocator<char>::~allocator((allocator<char> *)&local_999);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"distantlight",&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a18,
             "--distantlight x y z r g b a: adds a distant light with direction xyz, intensity rgb, and opening angle a"
             ,&local_a19);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__3>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator((allocator<char> *)&local_a19);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffff5c0,"triangle-plane",
             (allocator *)&stack0xfffffffffffff5bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a70,
             "--triangle-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane build of triangles originated at p0 and spanned by the vectors dx and dy with a tessellation width/height."
             ,&local_a71);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__4>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_a70);
  std::allocator<char>::~allocator((allocator<char> *)&local_a71);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff5c0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff5bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a98,"quad-plane",&local_a99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ac8,
             "--quad-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane build of quadrilaterals originated at p0 and spanned by the vectors dx and dy with a tessellation width/height."
             ,&local_ac9);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__5>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_ac8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  std::__cxx11::string::~string(local_a98);
  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_af0,"grid-plane",&local_af1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b20,
             "--grid-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane using a grid mesh build. The plane is originated at p0 and spanned by the vectors dx and dy with a tessellation width/height."
             ,&local_b21);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__6>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_b20);
  std::allocator<char>::~allocator((allocator<char> *)&local_b21);
  std::__cxx11::string::~string(local_af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_af1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b48,"subdiv-plane",&local_b49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b78,
             "--subdiv-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height tessellationRate: adds a plane build as a Catmull Clark subdivision surface originated at p0 and spanned by the vectors dx and dy. The plane consists of widt x height many patches, and each patch has the specified tessellation rate."
             ,&local_b79);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__7>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_b79);
  std::__cxx11::string::~string(local_b48);
  std::allocator<char>::~allocator((allocator<char> *)&local_b49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ba0,"hair-plane",&local_ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_bd0,
             "--hair-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z length radius num: adds a hair plane originated at p0 and spanned by the vectors dx and dy. num hairs are generated with specified length and radius."
             ,&local_bd1);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__8>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_bd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
  std::__cxx11::string::~string(local_ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf8,"curve-plane",&local_bf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c28,
             "--curve-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z length radius: adds a plane build of bezier curves originated at p0 and spanned by the vectors dx and dy. num curves are generated with specified length and radius."
             ,&local_c29);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__9>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_c28);
  std::allocator<char>::~allocator((allocator<char> *)&local_c29);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c50,"sphere",&local_c51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c80,"--sphere p.x p.y p.z r: adds a sphere at position p with radius r",
             &local_c81);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__10>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_c80);
  std::allocator<char>::~allocator((allocator<char> *)&local_c81);
  std::__cxx11::string::~string(local_c50);
  std::allocator<char>::~allocator((allocator<char> *)&local_c51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca8,"triangle-sphere",&local_ca9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_cd8,
             "--triangle-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r and tessellation numPhi build of triangles."
             ,&local_cd9);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__11>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_cd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
  std::__cxx11::string::~string(local_ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d00,"quad-sphere",&local_d01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d30,
             "--quad-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r and tessellation numPhi build of quadrilaterals."
             ,&local_d31);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__12>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  std::__cxx11::string::~string(local_d00);
  std::allocator<char>::~allocator((allocator<char> *)&local_d01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d58,"grid-sphere",&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d88,
             "--grid-sphere p.x p.y p.z r N: adds a grid sphere at position p with radius r using a cube topology and N*N quads at each face."
             ,&local_d89);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__13>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_d88);
  std::allocator<char>::~allocator((allocator<char> *)&local_d89);
  std::__cxx11::string::~string(local_d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_db0,"triangle-sphere-mblur",&local_db1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_de0,
             "--triangle-sphere-mblur p.x p.y p.z d.x d.y d.z r numPhi : adds a motion blurred sphere build of triangles at position p, with motion vector d, radius r, and tessellation numPhi."
             ,&local_de1);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__14>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_de0);
  std::allocator<char>::~allocator((allocator<char> *)&local_de1);
  std::__cxx11::string::~string(local_db0);
  std::allocator<char>::~allocator((allocator<char> *)&local_db1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e08,"quad-sphere-mblur",&local_e09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e38,
             "--quad-sphere-mblur p.x p.y p.z d.x d.y d.z r numPhi : adds a motion blurred sphere build of quadrilaterals at position p, with motion vector d, radius r, and tessellation numPhi."
             ,&local_e39);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__15>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_e38);
  std::allocator<char>::~allocator((allocator<char> *)&local_e39);
  std::__cxx11::string::~string(local_e08);
  std::allocator<char>::~allocator((allocator<char> *)&local_e09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e60,"subdiv-sphere",&local_e61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e90,
             "--subdiv-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r build of Catmull Clark subdivision surfaces. The sphere consists of numPhi x numPhi many patches and each path has the specified tessellation rate."
             ,&local_e91);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__16>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_e90);
  std::allocator<char>::~allocator((allocator<char> *)&local_e91);
  std::__cxx11::string::~string(local_e60);
  std::allocator<char>::~allocator((allocator<char> *)&local_e61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_eb8,"point-sphere",&local_eb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ee8,
             "--point-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of spheres."
             ,&local_ee9);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__17>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_ee8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
  std::__cxx11::string::~string(local_eb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f10,"point-sphere-mblur",&local_f11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f40,
             "--point-sphere p.x p.y p.z d.x d.y d.z r pointR numPhi: adds a sphere at position p, motion vector d, with radius r and tessellation numPhi build of spheres."
             ,&local_f41);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__18>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_f40);
  std::allocator<char>::~allocator((allocator<char> *)&local_f41);
  std::__cxx11::string::~string(local_f10);
  std::allocator<char>::~allocator((allocator<char> *)&local_f11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f68,"disc-sphere",&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f98,
             "--disc-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of discs."
             ,&local_f99);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__19>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_f98);
  std::allocator<char>::~allocator((allocator<char> *)&local_f99);
  std::__cxx11::string::~string(local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fc0,"oriented-disc-sphere",&local_fc1);
  paVar4 = &local_ff1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ff0,
             "--oriented-disc-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of oriented discs."
             ,paVar4);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__20>
            (in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_ff0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
  std::__cxx11::string::~string(local_fc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fc1);
  paVar4 = &local_1019;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1018,"print-cameras",paVar4);
  this_00 = (Application *)local_1049;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1049 + 1),"--print-cameras: prints all camera names of the scene",
             (allocator *)this_00);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__43>
            (this_00,in_stack_ffffffffffffebf8,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string((string *)(local_1049 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1049);
  std::__cxx11::string::~string(local_1018);
  std::allocator<char>::~allocator((allocator<char> *)&local_1019);
  name = (string *)local_1071;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1071 + 1),"camera",(allocator *)name);
  paVar4 = &local_10a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10a0,"--camera: use camera with specified name",paVar4);
  Application::
  registerOption<embree::SceneLoadingTutorialApplication::SceneLoadingTutorialApplication(std::__cxx11::string_const&,int)::__44>
            (this_00,name,(anon_class_8_1_8991fb9c_for_f *)paVar4,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(local_10a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
  std::__cxx11::string::~string((string *)(local_1071 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1071);
  return;
}

Assistant:

SceneLoadingTutorialApplication::SceneLoadingTutorialApplication (const std::string& tutorialName, int features)

    : TutorialApplication(tutorialName, features),
      scene(new SceneGraph::GroupNode),
      convert_tris_to_quads_prop(inf),
      grid_resX(2),
      grid_resY(2),
      remove_mblur(false),
      remove_non_mblur(false),
      sceneFilename(),
      instancing_mode(SceneGraph::INSTANCING_NONE),
      print_scene_cameras(false)
  {
    registerOption("i", [this] (Ref<ParseStream> cin, const FileName& path) {
        sceneFilename.push_back(path + cin->getFileName());
      }, "-i <filename>: parses scene from <filename>");

    registerOption("animlist", [this] (Ref<ParseStream> cin, const FileName& path) {
        FileName listFilename = path + cin->getFileName();

        std::ifstream listFile;
        listFile.open(listFilename.c_str());
        if (!listFile.is_open()) {
          THROW_RUNTIME_ERROR("cannot open " + listFilename.str());
        }
        else
        {
          while (!listFile.eof())
          {
            std::string line;
            listFile >> line;
            if (line != "")
              keyFramesFilenames.push_back(listFilename.path() + line);
          }
        }
      }, "-animlist <filename>: parses a sequence of .obj/.xml files listed in <filename> and adds them to the scene");

    registerOption("convert-triangles-to-quads", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_TRIANGLES_TO_QUADS);
        convert_tris_to_quads_prop = inf;
      }, "--convert-triangles-to-quads: converts all triangles to quads when loading");

    registerOption("convert-triangles-to-triangles-and-quads", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_TRIANGLES_TO_QUADS);
        convert_tris_to_quads_prop = 0.5f;
      }, "--convert-triangles-to-triangles-and-quads: converts to mixed triangle/quad scene");

    registerOption("convert-bezier-to-lines", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_BEZIER_TO_LINES);
      }, "--convert-bezier-to-lines: converts all bezier curves to line segments when loading");

    registerOption("convert-flat-to-round-curves", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_FLAT_TO_ROUND_CURVES);
      }, "--convert-flat-to-round-curves: converts all flat curves to round curves");
    registerOptionAlias("convert-flat-to-round-curves","convert-hair-to-curves"); // for compatibility reasons

    registerOption("convert-round-to-flat-curves", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_ROUND_TO_FLAT_CURVES);
      }, "--convert-round-to-flat-curves: converts all round curves to flat curves");
    
    registerOption("convert-bezier-to-bspline", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_BEZIER_TO_BSPLINE);
      }, "--convert-bezier-to-bspline: converts all bezier curves to bsplines curves");

    registerOption("convert-bspline-to-bezier", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_BSPLINE_TO_BEZIER);
      }, "--convert-bspline-to-bezier: converts all bsplines curves to bezier curves");

    registerOption("convert-bezier-to-hermite", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_BEZIER_TO_HERMITE);
      }, "--convert-bezier-to-hermite: converts all bezier curves to hermite curves");

    registerOption("merge-triangles-to-grids", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_TRIANGLES_TO_QUADS);
        sgop.push_back(MERGE_QUADS_TO_GRIDS);
      }, "--merge-triangles-to-grids: merges quads to grids");
    
    registerOption("merge-quads-to-grids", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(MERGE_QUADS_TO_GRIDS);
      }, "--merge-quads-to-grids: merges quads to grids");

    registerOption("convert-quads-to-grids", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_QUADS_TO_GRIDS);
      }, "--convert-quads-to-grids: converts all quads to grids");

    registerOption("convert-grids-to-quads", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_GRIDS_TO_QUADS);
      }, "--convert-grids-to-quads: converts all grids to quads");

    registerOption("convert-triangles-to-grids", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_TRIANGLES_TO_QUADS);
        sgop.push_back(CONVERT_QUADS_TO_GRIDS);
      }, "--convert-triangles-to-grids: converts all triangles to grids");

    registerOption("convert-triangles-to-grids-to-quads", [this] (Ref<ParseStream> cin, const FileName& path) {
        sgop.push_back(CONVERT_TRIANGLES_TO_QUADS);
        sgop.push_back(CONVERT_QUADS_TO_GRIDS);
        sgop.push_back(CONVERT_GRIDS_TO_QUADS);
      }, "--convert-triangles-to-grids-to-quads: converts all triangles to grids and then to quads");

    registerOption("grid-res", [this] (Ref<ParseStream> cin, const FileName& path) {
        grid_resX = min(max(cin->getInt(),2),0x7fff);
        grid_resY = min(max(cin->getInt(),2),0x7fff);        
      }, "--grid-res: sets tessellation resolution for the grid primitive");

    registerOption("convert-mblur-to-nonmblur", [this] (Ref<ParseStream> cin, const FileName& path) {
         sgop.push_back(CONVERT_MBLUR_TO_NONMBLUR);
      }, "--convert-mblur-to-nonmblur: converts all motion blur geometry to non-motion blur geometry");
    
    registerOption("remove-mblur", [this] (Ref<ParseStream> cin, const FileName& path) {
         remove_mblur = true;
      }, "--remove-mblur: removes all motion blur geometry");

    registerOption("remove-non-mblur", [this] (Ref<ParseStream> cin, const FileName& path) {
         remove_non_mblur = true;
      }, "--remove-non-mblur: removes all non-motion blur geometry");

    registerOption("instancing", [this] (Ref<ParseStream> cin, const FileName& path) {
        std::string mode = cin->getString();
        if      (mode == "none"    ) instancing_mode = SceneGraph::INSTANCING_NONE;
        else if (mode == "scene_geometry") instancing_mode = SceneGraph::INSTANCING_GEOMETRY; // for compatibility
        else if (mode == "scene_group"   ) instancing_mode = SceneGraph::INSTANCING_GROUP; // for compatibility
        else if (mode == "geometry") instancing_mode = SceneGraph::INSTANCING_GEOMETRY;
        else if (mode == "group"   ) instancing_mode = SceneGraph::INSTANCING_GROUP;
        else if (mode == "flattened") instancing_mode = SceneGraph::INSTANCING_FLATTENED;
        else if (mode == "multi_level") instancing_mode = SceneGraph::INSTANCING_MULTI_LEVEL;
        else throw std::runtime_error("unknown instancing mode: "+mode);
        g_instancing_mode = instancing_mode;
      }, "--instancing: set instancing mode\n"
      "  none: perform no instancing and flatten entire scene\n"
      "  geometry: instance individual geometries as scenes\n"
      "  group: instance geometry groups as scenes\n"
      "  multi_level: use multi-level instancing\n"
      "  flattened: assume flattened scene graph");

    registerOption("animation", [] (Ref<ParseStream> cin, const FileName& path) {
         g_animation_mode = true;
      }, "--animation: render animated geometries");

    registerOption("ambientlight", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f L = cin->getVec3f();
        futures.push_back([=]() { scene->add(new SceneGraph::LightNodeImpl<SceneGraph::AmbientLight>(SceneGraph::AmbientLight(L))); });
      }, "--ambientlight r g b: adds an ambient light with intensity rgb");
    registerOptionAlias("ambientlight","ambient");

    registerOption("pointlight", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f P = cin->getVec3f();
        const Vec3f I = cin->getVec3f();
        futures.push_back([=]() { scene->add(new SceneGraph::LightNodeImpl<SceneGraph::PointLight>(SceneGraph::PointLight(P,I))); });
      }, "--pointlight x y z r g b: adds a point light at position xyz with intensity rgb");

    registerOption("directionallight", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f D = cin->getVec3f();
        const Vec3f E = cin->getVec3f();
        futures.push_back([=]() { scene->add(new SceneGraph::LightNodeImpl<SceneGraph::DirectionalLight>(SceneGraph::DirectionalLight(D,E))); });
      }, "--directionallight x y z r g b: adds a directional light with direction xyz and intensity rgb");
    registerOptionAlias("directionallight","dirlight");

    registerOption("distantlight", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f D = cin->getVec3f();
        const Vec3f L = cin->getVec3f();
        const float halfAngle = cin->getFloat();
        futures.push_back([=]() { scene->add(new SceneGraph::LightNodeImpl<SceneGraph::DistantLight>(SceneGraph::DistantLight(D,L,halfAngle))); });
      }, "--distantlight x y z r g b a: adds a distant light with direction xyz, intensity rgb, and opening angle a");

    registerOption("triangle-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const size_t width = cin->getInt();
        const size_t height = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createTrianglePlane(p0,dx,dy,width,height,new OBJMaterial)); });
      }, "--triangle-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane build of triangles originated at p0 and spanned by the vectors dx and dy with a tessellation width/height.");

    registerOption("quad-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const size_t width = cin->getInt();
        const size_t height = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createQuadPlane(p0,dx,dy,width,height,new OBJMaterial)); });
      }, "--quad-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane build of quadrilaterals originated at p0 and spanned by the vectors dx and dy with a tessellation width/height.");

    registerOption("grid-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const size_t width = cin->getInt();
        const size_t height = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createGridPlane(p0,dx,dy,width,height,new OBJMaterial)); });
      }, "--grid-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height: adds a plane using a grid mesh build. The plane is originated at p0 and spanned by the vectors dx and dy with a tessellation width/height.");

    registerOption("subdiv-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const size_t width = cin->getInt();
        const size_t height = cin->getInt();
        const float tessellationRate = cin->getFloat();
        futures.push_back([=]() { scene->add(SceneGraph::createSubdivPlane(p0,dx,dy,width,height,tessellationRate,new OBJMaterial)); });
      }, "--subdiv-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z width height tessellationRate: adds a plane build as a Catmull Clark subdivision surface originated at p0 and spanned by the vectors dx and dy. The plane consists of widt x height many patches, and each patch has the specified tessellation rate.");

    registerOption("hair-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const float len = cin->getFloat();
        const float r = cin->getFloat();
        const size_t N = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createHairyPlane(0,p0,dx,dy,len,r,N,SceneGraph::FLAT_CURVE,new OBJMaterial)); });
      }, "--hair-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z length radius num: adds a hair plane originated at p0 and spanned by the vectors dx and dy. num hairs are generated with specified length and radius.");

    registerOption("curve-plane", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p0 = cin->getVec3f();
        const Vec3f dx = cin->getVec3f();
        const Vec3f dy = cin->getVec3f();
        const float len = cin->getFloat();
        const float r = cin->getFloat();
        const size_t N = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createHairyPlane(0,p0,dx,dy,len,r,N,SceneGraph::ROUND_CURVE,new OBJMaterial)); });
      }, "--curve-plane p.x p.y p.z dx.x dx.y dx.z dy.x dy.y dy.z length radius: adds a plane build of bezier curves originated at p0 and spanned by the vectors dx and dy. num curves are generated with specified length and radius.");

     registerOption("sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
         const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        futures.push_back([=]() { scene->add(SceneGraph::createSphere(p, r, new OBJMaterial)); });
      }, "--sphere p.x p.y p.z r: adds a sphere at position p with radius r");
     
    registerOption("triangle-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createTriangleSphere(p,r,numPhi,new OBJMaterial)); });
      }, "--triangle-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r and tessellation numPhi build of triangles.");

    registerOption("quad-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createQuadSphere(p,r,numPhi,new OBJMaterial)); });
      }, "--quad-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r and tessellation numPhi build of quadrilaterals.");

    registerOption("grid-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t N = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createGridSphere(p,r,N,new OBJMaterial)); });
      }, "--grid-sphere p.x p.y p.z r N: adds a grid sphere at position p with radius r using a cube topology and N*N quads at each face.");

    registerOption("triangle-sphere-mblur", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const Vec3f dp = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() {
          Ref<SceneGraph::Node> mesh = SceneGraph::createTriangleSphere(p,r,numPhi,new OBJMaterial);
          mesh->set_motion_vector(dp); 
          scene->add(mesh);
        });
      }, "--triangle-sphere-mblur p.x p.y p.z d.x d.y d.z r numPhi : adds a motion blurred sphere build of triangles at position p, with motion vector d, radius r, and tessellation numPhi.");

    registerOption("quad-sphere-mblur", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const Vec3f dp = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() {
          Ref<SceneGraph::Node> mesh = SceneGraph::createQuadSphere(p,r,numPhi,new OBJMaterial);
          mesh->set_motion_vector(dp); 
          scene->add(mesh);
        });
      }, "--quad-sphere-mblur p.x p.y p.z d.x d.y d.z r numPhi : adds a motion blurred sphere build of quadrilaterals at position p, with motion vector d, radius r, and tessellation numPhi.");

    registerOption("subdiv-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const size_t numPhi = cin->getInt();
        const float tessellationRate = cin->getFloat();
        futures.push_back([=]() { scene->add(SceneGraph::createSubdivSphere(p,r,numPhi,tessellationRate,new OBJMaterial)); });
      }, "--subdiv-sphere p.x p.y p.z r numPhi: adds a sphere at position p with radius r build of Catmull Clark subdivision surfaces. The sphere consists of numPhi x numPhi many patches and each path has the specified tessellation rate.");

    registerOption("point-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const float pointR = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createPointSphere(p, r, pointR, numPhi, SceneGraph::SPHERE, new OBJMaterial)); });
      }, "--point-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of spheres.");

     registerOption("point-sphere-mblur", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const Vec3f dp = cin->getVec3f();
        const float  r = cin->getFloat();
        const float pointR = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createPointSphere(p, r, pointR, numPhi, SceneGraph::SPHERE, new OBJMaterial)->set_motion_vector(dp)); });
      }, "--point-sphere p.x p.y p.z d.x d.y d.z r pointR numPhi: adds a sphere at position p, motion vector d, with radius r and tessellation numPhi build of spheres.");

    registerOption("disc-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const float pointR = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createPointSphere(p, r, pointR, numPhi, SceneGraph::DISC, new OBJMaterial)); });
      }, "--disc-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of discs.");

    registerOption("oriented-disc-sphere", [this] (Ref<ParseStream> cin, const FileName& path) {
        const Vec3f p = cin->getVec3f();
        const float  r = cin->getFloat();
        const float pointR = cin->getFloat();
        const size_t numPhi = cin->getInt();
        futures.push_back([=]() { scene->add(SceneGraph::createPointSphere(p, r, pointR, numPhi, SceneGraph::ORIENTED_DISC, new OBJMaterial)); });
      }, "--oriented-disc-sphere p.x p.y p.z r pointR numPhi: adds a sphere at position p with radius r and tessellation numPhi build of oriented discs.");

    registerOption("print-cameras", [this] (Ref<ParseStream> cin, const FileName& path) {
        print_scene_cameras = true;
      }, "--print-cameras: prints all camera names of the scene");

    registerOption("camera", [this] (Ref<ParseStream> cin, const FileName& path) {
        camera_name = cin->getString();
      }, "--camera: use camera with specified name");
  }